

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O1

ssize_t tnt_object_vformat(tnt_stream *s,char *fmt,__va_list_tag *vl)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint32_t len;
  char *__s;
  bool bVar4;
  bool bVar5;
  long lVar6;
  uint32_t *puVar7;
  double *pdVar8;
  size_t sVar9;
  uint64_t *puVar10;
  ulong *puVar11;
  int *piVar12;
  uint *puVar13;
  undefined8 *puVar14;
  ssize_t sVar15;
  long lVar16;
  ulong value;
  byte *pbVar17;
  bool bVar18;
  
  if (s->wrcnt != 0) {
    return -1;
  }
  *(undefined4 *)(*(long *)((long)s->data + 0x30) + 0xc) = 2;
  lVar16 = 0;
  do {
    bVar2 = *fmt;
    if (0x5c < bVar2) {
      if (bVar2 == 0x5d) {
LAB_00113715:
        lVar6 = tnt_object_container_close(s);
      }
      else {
        if (bVar2 != 0x7b) {
          if (bVar2 != 0x7d) goto LAB_001137b9;
          goto LAB_00113715;
        }
        lVar6 = tnt_object_add_map(s,0);
      }
LAB_001137ac:
      if (lVar6 == -1) {
        return -1;
      }
LAB_001137b6:
      lVar16 = lVar16 + lVar6;
      goto LAB_001137b9;
    }
    if (0x4d < bVar2) {
      if (bVar2 == 0x4e) {
        if ((((byte *)fmt)[1] != 0x49) || (((byte *)fmt)[2] != 0x4c)) goto LAB_001137b9;
        lVar6 = tnt_object_add_nil(s);
        if (lVar6 == -1) {
          return -1;
        }
        fmt = (char *)((byte *)fmt + 2);
        goto LAB_001137b6;
      }
      if (bVar2 == 0x5b) {
        lVar6 = tnt_object_add_array(s,0);
        goto LAB_001137ac;
      }
      goto LAB_001137b9;
    }
    if (bVar2 != 0x25) {
      if (bVar2 == 0) {
        return lVar16;
      }
      goto LAB_001137b9;
    }
    pbVar1 = (byte *)fmt + 1;
    bVar2 = ((byte *)fmt)[1];
    pbVar17 = pbVar1;
    if (0x72 < bVar2) {
      if (bVar2 == 0x73) {
        uVar3 = vl->gp_offset;
        if ((ulong)uVar3 < 0x29) {
          puVar14 = (undefined8 *)((ulong)uVar3 + (long)vl->reg_save_area);
          vl->gp_offset = uVar3 + 8;
        }
        else {
          puVar14 = (undefined8 *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar14 + 1;
        }
        __s = (char *)*puVar14;
        sVar9 = strlen(__s);
        lVar6 = tnt_object_add_str(s,__s,(uint32_t)sVar9);
        goto LAB_00113958;
      }
      if (bVar2 != 0x75) goto switchD_00113759_caseD_63;
      uVar3 = vl->gp_offset;
      if ((ulong)uVar3 < 0x29) {
        puVar13 = (uint *)((ulong)uVar3 + (long)vl->reg_save_area);
        vl->gp_offset = uVar3 + 8;
      }
      else {
        puVar13 = (uint *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar13 + 2;
      }
      value = (ulong)*puVar13;
      bVar5 = true;
      bVar4 = false;
      goto LAB_00113c99;
    }
    switch(bVar2) {
    case 0x62:
switchD_00113759_caseD_62:
      uVar3 = vl->gp_offset;
      if ((ulong)uVar3 < 0x29) {
        piVar12 = (int *)((ulong)uVar3 + (long)vl->reg_save_area);
        vl->gp_offset = uVar3 + 8;
      }
      else {
        piVar12 = (int *)vl->overflow_arg_area;
        vl->overflow_arg_area = piVar12 + 2;
      }
      lVar6 = tnt_object_add_bool(s,*piVar12 != 0);
      break;
    case 99:
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
      goto switchD_00113759_caseD_63;
    case 100:
    case 0x69:
      uVar3 = vl->gp_offset;
      if ((ulong)uVar3 < 0x29) {
        piVar12 = (int *)((ulong)uVar3 + (long)vl->reg_save_area);
        vl->gp_offset = uVar3 + 8;
      }
      else {
        piVar12 = (int *)vl->overflow_arg_area;
        vl->overflow_arg_area = piVar12 + 2;
      }
      value = (ulong)*piVar12;
      bVar4 = true;
      bVar5 = false;
      goto LAB_00113c99;
    case 0x66:
      uVar3 = vl->fp_offset;
      if ((ulong)uVar3 < 0xa1) {
        pdVar8 = (double *)((ulong)uVar3 + (long)vl->reg_save_area);
        vl->fp_offset = uVar3 + 0x10;
      }
      else {
        pdVar8 = (double *)vl->overflow_arg_area;
        vl->overflow_arg_area = pdVar8 + 1;
      }
      lVar6 = tnt_object_add_float(s,(float)*pdVar8);
      break;
    case 0x6c:
      if (((byte *)fmt)[2] != 0x66) {
        if (bVar2 != 0x6c) {
          if (bVar2 == 0x62) goto switchD_00113759_caseD_62;
          goto switchD_00113759_caseD_63;
        }
        if ((((byte *)fmt)[2] != 0x69) && (((byte *)fmt)[2] != 100)) goto switchD_00113759_caseD_63;
        uVar3 = vl->gp_offset;
        if ((ulong)uVar3 < 0x29) {
          puVar11 = (ulong *)((ulong)uVar3 + (long)vl->reg_save_area);
          vl->gp_offset = uVar3 + 8;
        }
        else {
          puVar11 = (ulong *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar11 + 1;
        }
        value = *puVar11;
        goto LAB_00113bda;
      }
      uVar3 = vl->fp_offset;
      if ((ulong)uVar3 < 0xa1) {
        pdVar8 = (double *)((ulong)uVar3 + (long)vl->reg_save_area);
        vl->fp_offset = uVar3 + 0x10;
      }
      else {
        pdVar8 = (double *)vl->overflow_arg_area;
        vl->overflow_arg_area = pdVar8 + 1;
      }
      lVar6 = tnt_object_add_double(s,*pdVar8);
      pbVar17 = (byte *)fmt + 2;
      sVar15 = 0;
      if (lVar6 != -1) {
        sVar15 = lVar6;
      }
      goto joined_r0x00113bbc;
    default:
      if (bVar2 == 0x2e) {
        if ((((byte *)fmt)[2] == 0x2a) && (((byte *)fmt)[3] == 0x73)) {
          uVar3 = vl->gp_offset;
          if ((ulong)uVar3 < 0x29) {
            puVar7 = (uint32_t *)((ulong)uVar3 + (long)vl->reg_save_area);
            vl->gp_offset = uVar3 + 8;
          }
          else {
            puVar7 = (uint32_t *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar7 + 2;
          }
          len = *puVar7;
          uVar3 = vl->gp_offset;
          if ((ulong)uVar3 < 0x29) {
            puVar14 = (undefined8 *)((ulong)uVar3 + (long)vl->reg_save_area);
            vl->gp_offset = uVar3 + 8;
          }
          else {
            puVar14 = (undefined8 *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar14 + 1;
          }
          lVar6 = tnt_object_add_str(s,(char *)*puVar14,len);
          sVar15 = 0;
          if (lVar6 != -1) {
            sVar15 = lVar6;
          }
          pbVar17 = (byte *)fmt + 3;
          goto joined_r0x00113bbc;
        }
      }
      else if (bVar2 == 0) {
        __assert_fail("f[0]",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/tnt/tnt_object.c"
                      ,0x156,
                      "ssize_t tnt_object_vformat(struct tnt_stream *, const char *, struct __va_list_tag *)"
                     );
      }
switchD_00113759_caseD_63:
      if (bVar2 == 0x6c) {
        if (((byte *)fmt)[2] == 0x75) {
          uVar3 = vl->gp_offset;
          if ((ulong)uVar3 < 0x29) {
            puVar10 = (uint64_t *)((ulong)uVar3 + (long)vl->reg_save_area);
            vl->gp_offset = uVar3 + 8;
          }
          else {
            puVar10 = (uint64_t *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar10 + 1;
          }
          pbVar17 = (byte *)fmt + 2;
        }
        else {
          if ((((byte *)fmt)[2] == 0x6c) &&
             ((((byte *)fmt)[3] == 0x69 || (((byte *)fmt)[3] == 100)))) {
            uVar3 = vl->gp_offset;
            if ((ulong)uVar3 < 0x29) {
              puVar10 = (uint64_t *)((ulong)uVar3 + (long)vl->reg_save_area);
              vl->gp_offset = uVar3 + 8;
            }
            else {
              puVar10 = (uint64_t *)vl->overflow_arg_area;
              vl->overflow_arg_area = puVar10 + 1;
            }
            value = *puVar10;
LAB_00113c39:
            pbVar17 = (byte *)fmt + 3;
            bVar4 = true;
            bVar5 = false;
            goto LAB_00113c99;
          }
          if ((((byte *)fmt)[2] != 0x6c) || (((byte *)fmt)[3] != 0x75)) goto LAB_00113ad7;
          uVar3 = vl->gp_offset;
          if ((ulong)uVar3 < 0x29) {
            puVar10 = (uint64_t *)((ulong)uVar3 + (long)vl->reg_save_area);
            vl->gp_offset = uVar3 + 8;
          }
          else {
            puVar10 = (uint64_t *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar10 + 1;
          }
          pbVar17 = (byte *)fmt + 3;
        }
        value = *puVar10;
LAB_00113a97:
        bVar5 = true;
        bVar4 = false;
      }
      else {
LAB_00113ad7:
        if (bVar2 == 0x68) {
          if ((((byte *)fmt)[2] == 0x69) || (((byte *)fmt)[2] == 100)) {
            uVar3 = vl->gp_offset;
            if ((ulong)uVar3 < 0x29) {
              piVar12 = (int *)((ulong)uVar3 + (long)vl->reg_save_area);
              vl->gp_offset = uVar3 + 8;
            }
            else {
              piVar12 = (int *)vl->overflow_arg_area;
              vl->overflow_arg_area = piVar12 + 2;
            }
            value = (ulong)*piVar12;
LAB_00113bda:
            bVar4 = true;
            bVar5 = false;
          }
          else {
            if (((byte *)fmt)[2] != 0x75) {
              if ((((byte *)fmt)[2] == 0x68) &&
                 ((((byte *)fmt)[3] == 0x69 || (((byte *)fmt)[3] == 100)))) {
                uVar3 = vl->gp_offset;
                if ((ulong)uVar3 < 0x29) {
                  piVar12 = (int *)((ulong)uVar3 + (long)vl->reg_save_area);
                  vl->gp_offset = uVar3 + 8;
                }
                else {
                  piVar12 = (int *)vl->overflow_arg_area;
                  vl->overflow_arg_area = piVar12 + 2;
                }
                value = (ulong)*piVar12;
                goto LAB_00113c39;
              }
              if ((((byte *)fmt)[2] != 0x68) || (((byte *)fmt)[3] != 0x75)) goto LAB_00113c8a;
              uVar3 = vl->gp_offset;
              if ((ulong)uVar3 < 0x29) {
                puVar13 = (uint *)((ulong)uVar3 + (long)vl->reg_save_area);
                vl->gp_offset = uVar3 + 8;
              }
              else {
                puVar13 = (uint *)vl->overflow_arg_area;
                vl->overflow_arg_area = puVar13 + 2;
              }
              pbVar17 = (byte *)fmt + 3;
              value = (ulong)*puVar13;
              goto LAB_00113a97;
            }
            uVar3 = vl->gp_offset;
            if ((ulong)uVar3 < 0x29) {
              puVar13 = (uint *)((ulong)uVar3 + (long)vl->reg_save_area);
              vl->gp_offset = uVar3 + 8;
            }
            else {
              puVar13 = (uint *)vl->overflow_arg_area;
              vl->overflow_arg_area = puVar13 + 2;
            }
            value = (ulong)*puVar13;
            bVar5 = true;
            bVar4 = false;
          }
          pbVar17 = (byte *)fmt + 2;
        }
        else {
LAB_00113c8a:
          if (bVar2 != 0x25) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/tnt/tnt_object.c"
                          ,0x1a3,
                          "ssize_t tnt_object_vformat(struct tnt_stream *, const char *, struct __va_list_tag *)"
                         );
          }
          bVar4 = false;
          bVar5 = false;
          value = 0;
        }
      }
      goto LAB_00113c99;
    }
LAB_00113958:
    sVar15 = 0;
    if (lVar6 != -1) {
      sVar15 = lVar6;
    }
joined_r0x00113bbc:
    bVar18 = false;
    bVar5 = false;
    bVar4 = false;
    value = 0;
    lVar16 = lVar16 + sVar15;
    fmt = (char *)pbVar1;
    if (lVar6 != -1) {
LAB_00113c99:
      fmt = (char *)pbVar17;
      if (bVar4) {
        lVar6 = tnt_object_add_int(s,value);
      }
      else {
        bVar18 = true;
        if (!bVar5) goto LAB_00113cc5;
        lVar6 = tnt_object_add_uint(s,value);
      }
      bVar18 = lVar6 != -1;
      if (!bVar18) {
        lVar6 = 0;
      }
      lVar16 = lVar16 + lVar6;
    }
LAB_00113cc5:
    if (!bVar18) {
      return -1;
    }
LAB_001137b9:
    fmt = (char *)((byte *)fmt + 1);
  } while( true );
}

Assistant:

ssize_t tnt_object_vformat(struct tnt_stream *s, const char *fmt, va_list vl)
{
	if (tnt_object_type(s, TNT_SBO_PACKED) == -1)
		return -1;
	ssize_t result = 0, rv = 0;

	for (const char *f = fmt; *f; f++) {
		if (f[0] == '[') {
			if ((rv = tnt_object_add_array(s, 0)) == -1)
				return -1;
			result += rv;
		} else if (f[0] == '{') {
			if ((rv = tnt_object_add_map(s, 0)) == -1)
				return -1;
			result += rv;
		} else if (f[0] == ']' || f[0] == '}') {
			if ((rv = tnt_object_container_close(s)) == -1)
				return -1;
			result += rv;
		} else if (f[0] == '%') {
			f++;
			assert(f[0]);
			int64_t int_value = 0;
			int int_status = 0; /* 1 - signed, 2 - unsigned */

			if (f[0] == 'd' || f[0] == 'i') {
				int_value = va_arg(vl, int);
				int_status = 1;
			} else if (f[0] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
			} else if (f[0] == 's') {
				const char *str = va_arg(vl, const char *);
				uint32_t len = (uint32_t)strlen(str);
				if ((rv = tnt_object_add_str(s, str, len)) == -1)
					return -1;
				result += rv;
			} else if (f[0] == '.' && f[1] == '*' && f[2] == 's') {
				uint32_t len = va_arg(vl, uint32_t);
				const char *str = va_arg(vl, const char *);
				if ((rv = tnt_object_add_str(s, str, len)) == -1)
					return -1;
				result += rv;
				f += 2;
			} else if (f[0] == 'f') {
				float v = (float)va_arg(vl, double);
				if ((rv = tnt_object_add_float(s, v)) == -1)
					return -1;
				result += rv;
			} else if (f[0] == 'l' && f[1] == 'f') {
				double v = va_arg(vl, double);
				if ((rv = tnt_object_add_double(s, v)) == -1)
					return -1;
				result += rv;
				f++;
			} else if (f[0] == 'b') {
				bool v = (bool)va_arg(vl, int);
				if ((rv = tnt_object_add_bool(s, v)) == -1)
					return -1;
				result += rv;
			} else if (f[0] == 'l'
				   && (f[1] == 'd' || f[1] == 'i')) {
				int_value = va_arg(vl, long);
				int_status = 1;
				f++;
			} else if (f[0] == 'l' && f[1] == 'u') {
				int_value = va_arg(vl, unsigned long);
				int_status = 2;
				f++;
			} else if (f[0] == 'l' && f[1] == 'l'
				   && (f[2] == 'd' || f[2] == 'i')) {
				int_value = va_arg(vl, long long);
				int_status = 1;
				f += 2;
			} else if (f[0] == 'l' && f[1] == 'l' && f[2] == 'u') {
				int_value = va_arg(vl, unsigned long long);
				int_status = 2;
				f += 2;
			} else if (f[0] == 'h'
				   && (f[1] == 'd' || f[1] == 'i')) {
				int_value = va_arg(vl, int);
				int_status = 1;
				f++;
			} else if (f[0] == 'h' && f[1] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
				f++;
			} else if (f[0] == 'h' && f[1] == 'h'
				   && (f[2] == 'd' || f[2] == 'i')) {
				int_value = va_arg(vl, int);
				int_status = 1;
				f += 2;
			} else if (f[0] == 'h' && f[1] == 'h' && f[2] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
				f += 2;
			} else if (f[0] != '%') {
				/* unexpected format specifier */
				assert(false);
			}

			if (int_status == 1) {
				rv = tnt_object_add_int(s, int_value);
				if (rv == -1)
					return -1;
				result += rv;
			} else if (int_status == 2) {
				rv = tnt_object_add_uint(s, int_value);
				if (rv == -1)
					return -1;
				result += rv;
			}
		} else if (f[0] == 'N' && f[1] == 'I' && f[2] == 'L') {
			if ((rv = tnt_object_add_nil(s)) == -1)
				return -1;
			result += rv;
			f += 2;
		}
	}
	return result;
}